

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCodewordDecoder.cpp
# Opt level: O1

int ZXing::Pdf417::CodewordDecoder::GetCodeword(int symbol)

{
  int iVar1;
  ushort *puVar2;
  ulong uVar3;
  ushort *puVar4;
  difference_type __d;
  ulong uVar5;
  
  iVar1 = -1;
  if ((symbol & 0xffff0000U) == 0x10000) {
    uVar3 = 0xae3;
    puVar2 = &SYMBOL_TABLE;
    do {
      uVar5 = ~(uVar3 >> 1) + uVar3;
      puVar4 = (ushort *)((uVar3 & 0xfffffffffffffffe) + (long)puVar2);
      uVar3 = uVar3 >> 1;
      if ((uint)*puVar4 < (symbol & 0xffffU)) {
        puVar2 = puVar4 + 1;
        uVar3 = uVar5;
      }
    } while (0 < (long)uVar3);
    if ((puVar2 != (ushort *)CODEWORD_TABLE) && (*puVar2 == (ushort)symbol)) {
      iVar1 = (int)(puVar2[0xae3] - 1) % 0x3a1;
    }
  }
  return iVar1;
}

Assistant:

int
CodewordDecoder::GetCodeword(int symbol)
{
	if ((symbol & 0xFFFF0000) != 0x10000)
		return -1;
	symbol &= 0xFFFF;
	auto it = std::lower_bound(SYMBOL_TABLE.begin(), SYMBOL_TABLE.end(), symbol);
	if (it != SYMBOL_TABLE.end() && *it == symbol) {
		return (CODEWORD_TABLE[it - SYMBOL_TABLE.begin()] - 1) % NUMBER_OF_CODEWORDS;
	}
	return -1;
}